

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameEngineDriver.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  GameLoop *pGVar2;
  reference ppPVar3;
  reference ppCVar4;
  ulong __n;
  ulong __n_00;
  string local_50;
  
  std::operator<<((ostream *)&std::cout,"\x1b[34m");
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "--------------------------------------------------------");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "------------ Running the game start phase --------------");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "--------------------------------------------------------");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,"\x1b[30m");
  std::operator<<((ostream *)&std::cout,"\n");
  GameLoop::startSingle(true);
  __n_00 = 0;
  while( true ) {
    pGVar2 = GameLoop::getInstance();
    if ((ulong)((long)(pGVar2->allPlayers->super__Vector_base<Player_*,_std::allocator<Player_*>_>).
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(pGVar2->allPlayers->super__Vector_base<Player_*,_std::allocator<Player_*>_>).
                      _M_impl.super__Vector_impl_data._M_start >> 3) <= __n_00) break;
    __n = 0;
    while( true ) {
      pGVar2 = GameLoop::getInstance();
      ppPVar3 = std::vector<Player_*,_std::allocator<Player_*>_>::at(pGVar2->allPlayers,__n_00);
      if ((ulong)((long)((*ppPVar3)->pOwnedCountries->
                        super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl
                        .super__Vector_impl_data._M_finish -
                  (long)((*ppPVar3)->pOwnedCountries->
                        super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl
                        .super__Vector_impl_data._M_start >> 3) <= __n) break;
      poVar1 = std::operator<<((ostream *)&std::cout,"player ");
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      poVar1 = std::operator<<(poVar1," owns country : ");
      pGVar2 = GameLoop::getInstance();
      ppPVar3 = std::vector<Player_*,_std::allocator<Player_*>_>::at(pGVar2->allPlayers,__n_00);
      ppCVar4 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::at
                          ((*ppPVar3)->pOwnedCountries,__n);
      Map::Country::getCountryName_abi_cxx11_(&local_50,*ppCVar4);
      poVar1 = std::operator<<(poVar1,(string *)&local_50);
      std::operator<<(poVar1,"\n");
      std::__cxx11::string::~string((string *)&local_50);
      __n = __n + 1;
    }
    __n_00 = __n_00 + 1;
  }
  std::operator<<((ostream *)&std::cout,"\nprint map to compare with output of start : \n");
  pGVar2 = GameLoop::getInstance();
  Map::printMap(pGVar2->gameMap);
  std::operator<<((ostream *)&std::cout,"\n\n\x1b[34m");
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "--------------------------------------------------------");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "-------------------------- Deck ------------------------");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "--------------------------------------------------------");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,"\x1b[30m");
  poVar1 = std::operator<<((ostream *)&std::cout,"Number of cards in the deck: ");
  pGVar2 = GameLoop::getInstance();
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*pGVar2->gameDeck->deckSize);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"Number of countries in the map: ");
  GameLoop::getInstance();
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,"\n\n\x1b[34m");
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "--------------------------------------------------------");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "------------------ Distributing armies -----------------");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "--------------------------------------------------------");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,"\x1b[30m");
  pGVar2 = GameLoop::getInstance();
  GameLoop::distributeArmies(pGVar2);
  std::operator<<((ostream *)&std::cout,"\nprint map to see where armies went : \n");
  pGVar2 = GameLoop::getInstance();
  Map::printMap(pGVar2->gameMap);
  std::operator<<((ostream *)&std::cout,"\n\n\x1b[34m");
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "--------------------------------------------------------");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "--------------- Running the main game loop -------------");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "--------------------------------------------------------");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,"\x1b[30m");
  pGVar2 = GameLoop::getInstance();
  GameLoop::loop(pGVar2,200);
  GameLoop::resetInstance();
  return 0;
}

Assistant:

int main() {

    std::cout << "\033[34m";
    std::cout << "--------------------------------------------------------" << std::endl;
    std::cout << "------------ Running the game start phase --------------" << std::endl;
    std::cout << "--------------------------------------------------------" << std::endl;
    std::cout << "\033[30m";

    cout << "\n";

    GameLoop::startSingle(true);

    for (unsigned long i = 0; i < GameLoop::getInstance()->getAllPlayers()->size(); i++) {
        for (unsigned long j = 0;
             j < GameLoop::getInstance()->getAllPlayers()->at(i)->getOwnedCountries()->size(); j++) {
            cout << "player " << i << " owns country : "
                 << GameLoop::getInstance()->getAllPlayers()->at(i)->getOwnedCountries()->at(j)->getCountryName()
                 << "\n";
        }
    }

    cout << "\nprint map to compare with output of start : \n";

    GameLoop::getInstance()->getGameMap()->printMap();

    std::cout << "\n\n\033[34m";
    std::cout << "--------------------------------------------------------" << std::endl;
    std::cout << "-------------------------- Deck ------------------------" << std::endl;
    std::cout << "--------------------------------------------------------" << std::endl;
    std::cout << "\033[30m";

    cout << "Number of cards in the deck: " << *GameLoop::getInstance()->getGameDeck()->getNumberOfCards() << endl;
    cout << "Number of countries in the map: " << GameLoop::getInstance()->getGameMap()->getMapCountries()->size()
         << endl;

    std::cout << "\n\n\033[34m";
    std::cout << "--------------------------------------------------------" << std::endl;
    std::cout << "------------------ Distributing armies -----------------" << std::endl;
    std::cout << "--------------------------------------------------------" << std::endl;
    std::cout << "\033[30m";

    GameLoop::getInstance()->distributeArmies();

    cout << "\nprint map to see where armies went : \n";

    GameLoop::getInstance()->getGameMap()->printMap();

    std::cout << "\n\n\033[34m";
    std::cout << "--------------------------------------------------------" << std::endl;
    std::cout << "--------------- Running the main game loop -------------" << std::endl;
    std::cout << "--------------------------------------------------------" << std::endl;
    std::cout << "\033[30m";

    GameLoop::getInstance()->loop(200);
    GameLoop::resetInstance();
    return 0;
}